

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintTo<char16_t,std::char_traits<char16_t>>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *value,iu_ostream *os)

{
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> str;
  allocator<char16_t> local_31;
  char16_t *local_30 [4];
  
  std::__cxx11::u16string::
  u16string<std::basic_string_view<char16_t,std::char_traits<char16_t>>,void>
            ((u16string *)local_30,value,&local_31);
  UniversalTersePrint(local_30[0],os);
  std::__cxx11::u16string::~u16string((u16string *)local_30);
  return;
}

Assistant:

inline void PrintTo(const ::std::basic_string_view<CharT, Traits>& value, iu_ostream* os)
{
    const ::std::basic_string<CharT, Traits> str{ value };
    UniversalTersePrint(str.c_str(), os);
}